

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementTetraCorot_4.cpp
# Opt level: O2

void __thiscall
chrono::fea::ChElementTetraCorot_4::ComputeKRMmatricesGlobal(ChElementTetraCorot_4 *this)

{
  ChMatrixRef *in_RSI;
  double in_XMM0_Qa;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  
  ComputeKRMmatricesGlobal
            ((ChElementTetraCorot_4 *)&this[-1].field_0x1b8,in_RSI,in_XMM0_Qa,in_XMM1_Qa,in_XMM2_Qa)
  ;
  return;
}

Assistant:

void ChElementTetraCorot_4::ComputeKRMmatricesGlobal(ChMatrixRef H, double Kfactor, double Rfactor, double Mfactor) {
    assert((H.rows() == 12) && (H.cols() == 12));

    // warp the local stiffness matrix K in order to obtain global
    // tangent stiffness CKCt:
    ChMatrixDynamic<> CK(12, 12);
    ChMatrixDynamic<> CKCt(12, 12);  // the global, corotated, K matrix
    ChMatrixCorotation::ComputeCK(StiffnessMatrix, this->A, 4, CK);
    ChMatrixCorotation::ComputeKCt(CK, this->A, 4, CKCt);

    // ***TEST*** SYMMETRIZE TO AVOID ROUNDOFF ASYMMETRY
    for (int row = 0; row < CKCt.rows() - 1; ++row)
        for (int col = row + 1; col < CKCt.cols(); ++col)
            CKCt(row, col) = CKCt(col, row);

    //***DEBUG***
    double max_err = 0;
    int err_r = -1;
    int err_c = -1;
    for (int row = 0; row < StiffnessMatrix.rows(); ++row)
        for (int col = 0; col < StiffnessMatrix.cols(); ++col) {
            double diff = fabs(StiffnessMatrix(row, col) - StiffnessMatrix(col, row));
            if (diff > max_err) {
                max_err = diff;
                err_r = row;
                err_c = col;
            }
        }
    if (max_err > 1e-10)
        GetLog() << "NONSYMMETRIC local stiffness matrix! err " << max_err << " at " << err_r << "," << err_c << "\n";
    max_err = 0;
    err_r = -1;
    err_c = -1;
    double maxval = 0;
    for (int row = 0; row < CKCt.rows(); ++row)
        for (int col = 0; col < CKCt.cols(); ++col) {
            double diff = fabs(CKCt(row, col) - CKCt(col, row));
            if (diff > max_err) {
                max_err = diff;
                err_r = row;
                err_c = col;
            }
            if (CKCt(row, col) > maxval)
                maxval = CKCt(row, col);
        }
    if (max_err > 1e-10)
        GetLog() << "NONSYMMETRIC corotated matrix! err " << max_err << " at " << err_r << "," << err_c
                 << ",   maxval=" << maxval << "\n";

    // For K stiffness matrix and R damping matrix:
    double mkfactor = Kfactor + Rfactor * this->GetMaterial()->Get_RayleighDampingK();
    H = mkfactor * CKCt;

    // For M mass matrix:
    if (Mfactor) {
        double lumped_node_mass = (this->GetVolume() * this->Material->Get_density()) / 4.0;
        for (int id = 0; id < 12; id++) {
            double amfactor = Mfactor + Rfactor * this->GetMaterial()->Get_RayleighDampingM();
            H(id, id) += amfactor * lumped_node_mass;
        }
    }
    //***TO DO*** better per-node lumping, or 12x12 consistent mass matrix.
}